

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ld.h
# Opt level: O2

void __thiscall
LdSketchWrapper<4U>::Check
          (LdSketchWrapper<4U> *this,HashMap<4U> *mp,Abstract<4U> *another,
          vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
          *outs)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double dVar4;
  bool bVar5;
  undefined8 uVar6;
  uint uVar7;
  int iVar8;
  mapped_type *pmVar9;
  ostream *poVar10;
  int iVar11;
  __node_base *p_Var12;
  uint uVar13;
  uint uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  HashMap<4U> est1;
  HashMap<4U> est2;
  
  est1._M_h._M_buckets = &est1._M_h._M_single_bucket;
  est1._M_h._M_bucket_count = 1;
  auVar18 = ZEXT1664((undefined1  [16])0x0);
  est1._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  est1._M_h._M_element_count = 0;
  est1._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  est1._M_h._M_rehash_policy._M_next_resize = 0;
  est1._M_h._M_single_bucket = (__node_base_ptr)0x0;
  est2._M_h._M_buckets = &est2._M_h._M_single_bucket;
  est2._M_h._M_bucket_count = 1;
  est2._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  est2._M_h._M_element_count = 0;
  est2._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  est2._M_h._M_rehash_policy._M_next_resize = 0;
  est2._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var12 = &(mp->_M_h)._M_before_begin;
  iVar11 = 0;
  while( true ) {
    p_Var12 = p_Var12->_M_nxt;
    if (p_Var12 == (__node_base *)0x0) break;
    (*(this->super_Abstract<4U>)._vptr_Abstract[1])(this,p_Var12 + 1,&est1);
    (*another->_vptr_Abstract[1])
              (another,p_Var12 + 1,
               (_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                *)&est2);
    pmVar9 = std::__detail::
             _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&est1,&this->up_key);
    iVar3 = *pmVar9;
    pmVar9 = std::__detail::
             _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&est2,&this->low_key);
    uVar13 = iVar3 - *pmVar9;
    uVar7 = -uVar13;
    if (0 < (int)uVar13) {
      uVar7 = uVar13;
    }
    pmVar9 = std::__detail::
             _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&est2,&this->up_key);
    iVar3 = *pmVar9;
    pmVar9 = std::__detail::
             _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&est1,&this->low_key);
    uVar14 = iVar3 - *pmVar9;
    uVar13 = -uVar14;
    if (0 < (int)uVar14) {
      uVar13 = uVar14;
    }
    if (uVar13 < uVar7) {
      uVar13 = uVar7;
    }
    iVar3 = *(int *)((long)(p_Var12 + 1) + 4);
    iVar8 = -iVar3;
    if (0 < iVar3) {
      iVar8 = iVar3;
    }
    auVar16 = vpinsrd_avx(ZEXT416(uVar13),iVar8,1);
    iVar3 = (this->super_Abstract<4U>).HIT;
    auVar17._4_4_ = iVar3;
    auVar17._0_4_ = iVar3;
    auVar17._8_4_ = iVar3;
    auVar17._12_4_ = iVar3;
    uVar6 = vpcmpgtd_avx512vl(auVar16,auVar17);
    iVar11 = iVar11 + (uint)((~((byte)uVar6 & 0xf) & 3) == 0);
    auVar16 = vpcmpgtd_avx(auVar16,auVar17);
    auVar16 = vpsubd_avx(auVar18._0_16_,auVar16);
    auVar18 = ZEXT1664(auVar16);
  }
  auVar15._0_8_ = (double)iVar11;
  auVar16 = vcvtdq2pd_avx(auVar18._0_16_);
  auVar15._8_8_ = auVar15._0_8_;
  auVar16 = vdivpd_avx(auVar15,auVar16);
  (this->super_Abstract<4U>).pr = (double)auVar16._0_8_;
  (this->super_Abstract<4U>).cr = (double)auVar16._8_8_;
  auVar16 = vshufpd_avx(auVar16,auVar16,1);
  poVar10 = std::ostream::_M_insert<double>(auVar16._0_8_);
  std::operator<<(poVar10,",");
  poVar10 = std::ostream::_M_insert<double>((this->super_Abstract<4U>).pr);
  std::operator<<(poVar10,",");
  dVar1 = (this->super_Abstract<4U>).pr;
  dVar2 = (this->super_Abstract<4U>).cr;
  dVar4 = dVar1 + dVar2;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar4;
  uVar6 = vcmpsd_avx512f(auVar16,ZEXT816(0x3e112e0be826d695),1);
  bVar5 = (bool)((byte)uVar6 & 1);
  poVar10 = std::ostream::_M_insert<double>
                      (((dVar1 + dVar1) * dVar2) /
                       (double)((ulong)bVar5 * 0x3ff0000000000000 + (ulong)!bVar5 * (long)dVar4));
  std::operator<<(poVar10,",");
  std::
  _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&est2._M_h);
  std::
  _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&est1._M_h);
  return;
}

Assistant:

void Check(HashMap<DATA_LEN> mp, Abstract<DATA_LEN>* another, const std::vector<std::ostream*>& outs) {
		HashMap<DATA_LEN> est1, est2;

		typename HashMap<DATA_LEN>::iterator it;
		int value = 0, all = 0, hit = 0, size = 0;
		for (it = mp.begin(); it != mp.end(); ++it) {
			Query(it->first, est1);
			another->Query(it->first, est2);

			value = max(abs(est1[up_key] - est2[low_key]),
				abs(est2[up_key] - est1[low_key]));
			if (abs(it->second) > this->HIT) {
				all++;
				if (value > this->HIT) {
					hit += 1;
				}
			}
			if (value > this->HIT) size += 1;
		}

		this->cr = hit / (double)all;
		this->pr = hit / (double)size;
		*outs[0] << this->cr << ",";
		*outs[1] << this->pr << ",";
		*outs[2] << 2 * this->pr * this->cr / ((this->pr + this->cr < 1e-9) ? 1.0 : this->pr + this->cr) << ",";
	}